

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

uint64_t WABT_BYTES_TO_MIN_PAGES(uint64_t num_bytes,uint32_t page_size)

{
  ulong local_28;
  uint64_t num_pages;
  uint32_t page_size_local;
  uint64_t num_bytes_local;
  
  if ((page_size != 0) && ((page_size & page_size - 1) == 0)) {
    local_28 = num_bytes / page_size;
    if (page_size * local_28 - num_bytes != 0) {
      local_28 = local_28 + 1;
    }
    return local_28;
  }
  abort();
}

Assistant:

inline uint64_t WABT_BYTES_TO_MIN_PAGES(uint64_t num_bytes,
                                        uint32_t page_size) {
  if ((page_size == 0) ||
      (page_size & (page_size - 1))) {  // malformed page sizes
    WABT_UNREACHABLE;
    return 0;
  }
  uint64_t num_pages = num_bytes / page_size;
  return (page_size * num_pages == num_bytes) ? num_pages : num_pages + 1;
}